

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compile.c
# Opt level: O0

char * makeCharClass(uchar *cclass)

{
  int iVar1;
  char *local_50;
  char *ptr;
  int prev;
  int c;
  setter set;
  uchar bits [32];
  uchar *local_10;
  uchar *cclass_local;
  
  ptr._0_4_ = -1;
  local_10 = cclass;
  if (*cclass == '^') {
    memset(&set,0xff,0x20);
    _prev = charClassClear;
    local_10 = local_10 + 1;
  }
  else {
    memset(&set,0,0x20);
    _prev = charClassSet;
  }
  while (iVar1 = readChar(&local_10), iVar1 != 0) {
    if (((iVar1 == 0x2d) && (*local_10 != '\0')) && (-1 < (int)ptr)) {
      iVar1 = readChar(&local_10);
      for (; (int)ptr <= iVar1; ptr._0_4_ = (int)ptr + 1) {
        (*_prev)(&set,(int)ptr);
      }
      ptr._0_4_ = -1;
    }
    else {
      (*_prev)(&set);
      ptr._0_4_ = iVar1;
    }
  }
  local_50 = makeCharClass::string;
  for (ptr._4_4_ = 0; ptr._4_4_ < 0x20; ptr._4_4_ = ptr._4_4_ + 1) {
    iVar1 = sprintf(local_50,"\\%03o",(ulong)bits[(long)ptr._4_4_ + -8]);
    local_50 = local_50 + iVar1;
  }
  return makeCharClass::string;
}

Assistant:

static char *makeCharClass(unsigned char *cclass)
{
  unsigned char  bits[32];
  setter         set;
  int            c, prev= -1;
  static char    string[256];
  char          *ptr;

  if ('^' == *cclass)
    {
      memset(bits, 255, 32);
      set= charClassClear;
      ++cclass;
    }
  else
    {
      memset(bits, 0, 32);
      set= charClassSet;
    }
  while (0 != (c= readChar(&cclass)))
    {
      if ('-' == c && *cclass && prev >= 0)
        {
          for (c= readChar(&cclass); prev <= c; ++prev)
            set(bits, prev);
          prev= -1;
        }
      else
  {
    set(bits, prev= c);
  }
    }

  ptr= string;
  for (c= 0;  c < 32;  ++c)
    ptr += sprintf(ptr, "\\%03o", bits[c]);

  return string;
}